

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lex.c
# Opt level: O3

void build_scanners(Grammar *g)

{
  byte *pbVar1;
  undefined1 *puVar2;
  VecAction *v;
  ScanState **ppSVar3;
  anon_struct_40_4_d8687ec6 *paVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  State **ppSVar8;
  State *pSVar9;
  State *pSVar10;
  Action *pAVar11;
  Action **ppAVar12;
  Term *pTVar13;
  Action **ppAVar14;
  ScanState **ppSVar15;
  ScanState *pSVar16;
  ScanStateTransition **ppSVar17;
  Rule *pRVar18;
  char *pcVar19;
  bool bVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  int iVar23;
  uint uVar24;
  LexState *ls;
  NFAState *pNVar25;
  ushort **ppuVar26;
  __int32_t **pp_Var27;
  Action *trailing;
  NFAState *pNVar28;
  NFAState *pNVar29;
  DFAState *pDVar30;
  DFAState *x;
  ScanState *pSVar31;
  DFAState **ppDVar32;
  ScanStateTransition *t;
  ScanStateTransition *pSVar33;
  long lVar34;
  NFAState **ppNVar35;
  ulong uVar36;
  NFAState **ppNVar37;
  Action **ppAVar38;
  byte bVar39;
  anon_struct_40_4_d8687ec6_for_accepts *paVar40;
  VecAction *pVVar41;
  Scanner *pSVar42;
  ulong uVar43;
  ulong uVar44;
  Scanner *pSVar45;
  ulong uVar46;
  ulong uVar47;
  byte *pbVar48;
  uint uVar49;
  byte bVar50;
  ulong local_98;
  DFAState **ppDStack_90;
  DFAState *local_88 [3];
  anon_struct_40_4_d8687ec6_for_actions *local_70;
  NFAState **local_68;
  Grammar *local_60;
  Action **local_58;
  ulong local_50;
  NFAState **local_48;
  anon_struct_40_4_d8687ec6 *local_40;
  uint8 *local_38;
  
  bVar50 = 0;
  ls = (LexState *)calloc(1,0x40);
  uVar43 = (ulong)(g->states).n;
  if (uVar43 == 0) {
    uVar24 = 0;
  }
  else {
    ppSVar8 = (g->states).v;
    uVar36 = 0;
    do {
      pSVar9 = ppSVar8[uVar36];
      if (uVar36 != 0 && pSVar9->same_shifts == (State *)0x0) {
        uVar44 = 0;
        do {
          pSVar10 = ppSVar8[uVar44];
          if (((pSVar10->same_shifts == (State *)0x0) &&
              (uVar24 = (pSVar10->shift_actions).n, uVar24 == (pSVar9->shift_actions).n)) &&
             (((pSVar9->field_0x178 ^ pSVar10->field_0x178) & 0x38) == 0)) {
            if ((ulong)uVar24 == 0) {
LAB_0013f6b9:
              pSVar9->same_shifts = pSVar10;
              break;
            }
            uVar46 = 0;
            while ((pSVar9->shift_actions).v[uVar46]->term ==
                   (pSVar10->shift_actions).v[uVar46]->term) {
              uVar46 = uVar46 + 1;
              if (uVar24 == uVar46) goto LAB_0013f6b9;
            }
          }
          uVar44 = uVar44 + 1;
        } while (uVar44 != uVar36);
      }
      uVar36 = uVar36 + 1;
    } while (uVar36 != uVar43);
    local_60 = g;
    if (uVar43 != 0) {
      local_70 = &g->actions;
      local_58 = (g->actions).e;
      local_48 = (ls->allnfas).e;
      uVar24 = 0;
      uVar43 = 0;
LAB_0013f70f:
      pSVar9 = (g->states).v[uVar43];
      if ((pSVar9->shift_actions).n != 0) {
        local_50 = uVar43;
        if (pSVar9->same_shifts != (State *)0x0) {
          pSVar42 = &pSVar9->same_shifts->scanner;
          pSVar45 = &pSVar9->scanner;
          for (lVar34 = 10; lVar34 != 0; lVar34 = lVar34 + -1) {
            uVar5 = (pSVar42->states).i;
            (pSVar45->states).n = (pSVar42->states).n;
            (pSVar45->states).i = uVar5;
            pSVar42 = (Scanner *)((long)pSVar42 + (ulong)bVar50 * -0x10 + 8);
            pSVar45 = (Scanner *)((long)pSVar45 + (ulong)bVar50 * -0x10 + 8);
          }
          goto LAB_001409b2;
        }
        pNVar25 = new_NFAState(ls);
        if ((pSVar9->shift_actions).n != 0) {
          local_40 = pNVar25->chars;
          local_68 = pNVar25->chars[0].e;
          uVar43 = 0;
          bVar20 = false;
          do {
            pAVar11 = (pSVar9->shift_actions).v[uVar43];
            if (pAVar11->kind == ACTION_SHIFT) {
              pTVar13 = pAVar11->term;
              if (pTVar13->kind == TERM_STRING) {
                pbVar48 = (byte *)pTVar13->string;
                bVar39 = *pbVar48;
                pNVar28 = pNVar25;
                if ((pTVar13->field_0x2c & 8) == 0) {
                  while (bVar39 != 0) {
                    ppNVar35 = pNVar28->chars[bVar39].v;
                    if (pNVar28->chars[bVar39].n == 0) {
                      if (ppNVar35 == (NFAState **)0x0) {
                        pNVar29 = new_NFAState(ls);
                        bVar39 = *pbVar48;
                        ppNVar35 = pNVar28->chars[bVar39].e;
                        ppNVar35[-1] = (NFAState *)ppNVar35;
                        uVar24 = pNVar28->chars[*pbVar48].n;
                        pNVar28->chars[*pbVar48].n = uVar24 + 1;
                        pNVar28->chars[bVar39].e[uVar24] = pNVar29;
                      }
                      else {
                        pNVar29 = new_NFAState(ls);
                        if (ppNVar35 == pNVar28->chars[bVar39].e) {
                          bVar39 = *pbVar48;
                          ppNVar35 = pNVar28->chars[bVar39].v;
                          uVar24 = pNVar28->chars[bVar39].n;
                          pNVar28->chars[bVar39].n = uVar24 + 1;
                          ppNVar35[uVar24] = pNVar29;
                        }
                        else {
                          vec_add_internal(pNVar28->chars + bVar39,pNVar29);
                        }
                      }
                    }
                    else {
                      pNVar29 = *ppNVar35;
                    }
                    pbVar1 = pbVar48 + 1;
                    pbVar48 = pbVar48 + 1;
                    pNVar28 = pNVar29;
                    bVar39 = *pbVar1;
                  }
                }
                else if (bVar39 != 0) {
                  ppuVar26 = __ctype_b_loc();
                  pNVar29 = pNVar25;
                  do {
                    uVar36 = (ulong)bVar39;
                    if ((*(byte *)((long)*ppuVar26 + uVar36 * 2 + 1) & 4) == 0) {
                      ppNVar35 = pNVar29->chars[uVar36].v;
                      if (ppNVar35 == (NFAState **)0x0) {
                        pNVar28 = new_NFAState(ls);
                        bVar39 = *pbVar48;
                        ppNVar35 = pNVar29->chars[bVar39].e;
                        ppNVar35[-1] = (NFAState *)ppNVar35;
                        uVar24 = pNVar29->chars[*pbVar48].n;
                        pNVar29->chars[*pbVar48].n = uVar24 + 1;
                        pNVar29->chars[bVar39].e[uVar24] = pNVar28;
                      }
                      else {
                        paVar4 = pNVar29->chars + uVar36;
                        if (ppNVar35 == paVar4->e) {
                          if (2 < paVar4->n) goto LAB_0013fb11;
                        }
                        else if ((paVar4->n & 7) == 0) {
LAB_0013fb11:
                          pNVar28 = new_NFAState(ls);
                          vec_add_internal(paVar4,pNVar28);
                          goto LAB_0013fbbb;
                        }
                        pNVar28 = new_NFAState(ls);
                        bVar39 = *pbVar48;
                        ppNVar35 = pNVar29->chars[bVar39].v;
                        uVar24 = pNVar29->chars[bVar39].n;
                        pNVar29->chars[bVar39].n = uVar24 + 1;
                        ppNVar35[uVar24] = pNVar28;
                      }
                    }
                    else {
                      pp_Var27 = __ctype_toupper_loc();
                      ppNVar35 = pNVar29->chars[(*pp_Var27)[uVar36]].v;
                      if (ppNVar35 == (NFAState **)0x0) {
                        pNVar28 = new_NFAState(ls);
                        iVar23 = (*pp_Var27)[*pbVar48];
                        ppNVar35 = pNVar29->chars[iVar23].e;
                        ppNVar35[-1] = (NFAState *)ppNVar35;
                        uVar24 = pNVar29->chars[(*pp_Var27)[*pbVar48]].n;
                        pNVar29->chars[(*pp_Var27)[*pbVar48]].n = uVar24 + 1;
                        pNVar29->chars[iVar23].e[uVar24] = pNVar28;
                      }
                      else {
                        paVar4 = pNVar29->chars + (*pp_Var27)[uVar36];
                        if (ppNVar35 == paVar4->e) {
                          if (2 < paVar4->n) goto LAB_0013fb36;
                        }
                        else if ((paVar4->n & 7) == 0) {
LAB_0013fb36:
                          pNVar28 = new_NFAState(ls);
                          vec_add_internal(paVar4,pNVar28);
                          goto LAB_0013fb4d;
                        }
                        pNVar28 = new_NFAState(ls);
                        iVar23 = (*pp_Var27)[*pbVar48];
                        ppNVar35 = pNVar29->chars[iVar23].v;
                        uVar24 = pNVar29->chars[iVar23].n;
                        pNVar29->chars[iVar23].n = uVar24 + 1;
                        ppNVar35[uVar24] = pNVar28;
                      }
LAB_0013fb4d:
                      pp_Var27 = __ctype_tolower_loc();
                      paVar4 = pNVar29->chars + (*pp_Var27)[*pbVar48];
                      ppNVar35 = paVar4->v;
                      ppNVar37 = pNVar29->chars[(*pp_Var27)[*pbVar48]].e;
                      if (ppNVar35 == (NFAState **)0x0) {
                        paVar4->v = ppNVar37;
                        uVar24 = pNVar29->chars[(*pp_Var27)[*pbVar48]].n;
                        pNVar29->chars[(*pp_Var27)[*pbVar48]].n = uVar24 + 1;
                        paVar4->e[uVar24] = pNVar28;
                      }
                      else {
                        uVar24 = paVar4->n;
                        if (ppNVar35 == ppNVar37) {
                          if (uVar24 < 3) goto LAB_0013fb87;
                        }
                        else if ((uVar24 & 7) != 0) {
LAB_0013fb87:
                          paVar4->n = uVar24 + 1;
                          ppNVar35[uVar24] = pNVar28;
                          goto LAB_0013fbbb;
                        }
                        vec_add_internal(paVar4,pNVar28);
                      }
                    }
LAB_0013fbbb:
                    bVar39 = pbVar48[1];
                    pbVar48 = pbVar48 + 1;
                    pNVar29 = pNVar28;
                  } while (bVar39 != 0);
                }
                ppAVar12 = (pNVar28->accepts).v;
                ppAVar14 = (pNVar28->accepts).e;
                if (ppAVar12 == (Action **)0x0) {
                  (pNVar28->accepts).v = ppAVar14;
                  uVar24 = (pNVar28->accepts).n;
                  (pNVar28->accepts).n = uVar24 + 1;
                  (pNVar28->accepts).e[uVar24] = pAVar11;
                }
                else {
                  paVar40 = &pNVar28->accepts;
                  uVar24 = paVar40->n;
                  if (ppAVar12 == ppAVar14) {
                    if (uVar24 < 3) goto LAB_0013fc1c;
                  }
                  else if ((uVar24 & 7) != 0) {
LAB_0013fc1c:
                    paVar40->n = uVar24 + 1;
                    ppAVar12[uVar24] = pAVar11;
                    goto LAB_0013fcbb;
                  }
                  vec_add_internal(paVar40,pAVar11);
                }
LAB_0013fcbb:
                bVar20 = true;
              }
            }
            else if (pAVar11->kind == ACTION_ACCEPT) {
              ppNVar35 = pNVar25->chars[0].v;
              if (pNVar25->chars[0].n == 0) {
                if (ppNVar35 == (NFAState **)0x0) {
                  pNVar28 = new_NFAState(ls);
                  pNVar25->chars[0].v = local_68;
                  uVar24 = pNVar25->chars[0].n;
                  pNVar25->chars[0].n = uVar24 + 1;
                  pNVar25->chars[0].e[uVar24] = pNVar28;
                }
                else {
                  pNVar28 = new_NFAState(ls);
                  if (ppNVar35 == local_68) {
                    uVar24 = pNVar25->chars[0].n;
                    pNVar25->chars[0].n = uVar24 + 1;
                    pNVar25->chars[0].v[uVar24] = pNVar28;
                  }
                  else {
                    vec_add_internal(local_40,pNVar28);
                  }
                }
              }
              else {
                pNVar28 = *ppNVar35;
              }
              ppAVar12 = (pNVar28->accepts).v;
              ppAVar14 = (pNVar28->accepts).e;
              if (ppAVar12 == (Action **)0x0) {
                (pNVar28->accepts).v = ppAVar14;
                uVar24 = (pNVar28->accepts).n;
                (pNVar28->accepts).n = uVar24 + 1;
                (pNVar28->accepts).e[uVar24] = pAVar11;
              }
              else {
                paVar40 = &pNVar28->accepts;
                uVar24 = paVar40->n;
                if (ppAVar12 == ppAVar14) {
                  if (2 < uVar24) goto LAB_0013f963;
                }
                else if ((uVar24 & 7) == 0) {
LAB_0013f963:
                  vec_add_internal(paVar40,pAVar11);
                  goto LAB_0013f96e;
                }
                paVar40->n = uVar24 + 1;
                ppAVar12[uVar24] = pAVar11;
              }
LAB_0013f96e:
              bVar20 = true;
            }
            uVar43 = uVar43 + 1;
            uVar24 = (pSVar9->shift_actions).n;
          } while (uVar43 < uVar24);
          if (uVar24 != 0) {
            ppNVar35 = (pNVar25->epsilon).e;
            uVar43 = 0;
            do {
              pAVar11 = (pSVar9->shift_actions).v[uVar43];
              if ((pAVar11->kind == ACTION_SHIFT) && (pAVar11->term->kind == TERM_REGEX)) {
                trailing = (Action *)malloc(0x30);
                uVar21 = *(undefined4 *)&pAVar11->field_0x4;
                pTVar13 = pAVar11->term;
                pRVar18 = pAVar11->rule;
                pSVar10 = pAVar11->state;
                uVar5 = pAVar11->index;
                uVar22 = *(undefined4 *)&pAVar11->field_0x24;
                pcVar19 = pAVar11->temp_string;
                trailing->kind = pAVar11->kind;
                *(undefined4 *)&trailing->field_0x4 = uVar21;
                trailing->term = pTVar13;
                trailing->rule = pRVar18;
                trailing->state = pSVar10;
                trailing->index = uVar5;
                *(undefined4 *)&trailing->field_0x24 = uVar22;
                trailing->temp_string = pcVar19;
                trailing->kind = ACTION_SHIFT_TRAILING;
                uVar5 = local_60->action_count;
                local_60->action_count = uVar5 + 1;
                trailing->index = uVar5;
                local_38 = (uint8 *)pAVar11->term->string;
                ppNVar37 = (pNVar25->epsilon).v;
                if (ppNVar37 == (NFAState **)0x0) {
                  pNVar28 = new_NFAState(ls);
                  (pNVar25->epsilon).v = ppNVar35;
                  uVar24 = (pNVar25->epsilon).n;
                  (pNVar25->epsilon).n = uVar24 + 1;
                  (pNVar25->epsilon).e[uVar24] = pNVar28;
                }
                else {
                  uVar24 = (pNVar25->epsilon).n;
                  if (ppNVar37 == ppNVar35) {
                    if (2 < uVar24) goto LAB_0013fe03;
                  }
                  else if ((uVar24 & 7) == 0) {
LAB_0013fe03:
                    pNVar28 = new_NFAState(ls);
                    vec_add_internal(&pNVar25->epsilon,pNVar28);
                    goto LAB_0013fe1e;
                  }
                  pNVar28 = new_NFAState(ls);
                  uVar24 = (pNVar25->epsilon).n;
                  (pNVar25->epsilon).n = uVar24 + 1;
                  (pNVar25->epsilon).v[uVar24] = pNVar28;
                }
LAB_0013fe1e:
                pNVar29 = new_NFAState(ls);
                ls->ignore_case = *(uint *)&pAVar11->term->field_0x2c >> 3 & 1;
                iVar23 = build_regex_nfa(ls,&local_38,pNVar28,pNVar29,trailing);
                if (iVar23 == 0) {
                  free(trailing);
                }
                else {
                  puVar2 = &pAVar11->term->field_0x2c;
                  *puVar2 = *puVar2 | 0x10;
                  pSVar9->field_0x178 = pSVar9->field_0x178 | 0x40;
                  ppAVar14 = (local_60->actions).v;
                  if (ppAVar14 == (Action **)0x0) {
                    (local_60->actions).v = local_58;
                    uVar24 = (local_60->actions).n;
                    (local_60->actions).n = uVar24 + 1;
                    (local_60->actions).e[uVar24] = trailing;
                  }
                  else {
                    uVar24 = local_70->n;
                    if (ppAVar14 == local_58) {
                      if (uVar24 < 3) goto LAB_0013fe94;
                    }
                    else if ((uVar24 & 7) != 0) {
LAB_0013fe94:
                      local_70->n = uVar24 + 1;
                      ppAVar14[uVar24] = trailing;
                      goto LAB_0013feed;
                    }
                    vec_add_internal(local_70,trailing);
                  }
                }
LAB_0013feed:
                ppAVar12 = (pNVar29->accepts).v;
                ppAVar14 = (pNVar29->accepts).e;
                if (ppAVar12 == (Action **)0x0) {
                  (pNVar29->accepts).v = ppAVar14;
                  uVar24 = (pNVar29->accepts).n;
                  (pNVar29->accepts).n = uVar24 + 1;
                  (pNVar29->accepts).e[uVar24] = pAVar11;
                }
                else {
                  paVar40 = &pNVar29->accepts;
                  uVar24 = paVar40->n;
                  if (ppAVar12 == ppAVar14) {
                    if (2 < uVar24) goto LAB_0013ff4d;
                  }
                  else if ((uVar24 & 7) == 0) {
LAB_0013ff4d:
                    vec_add_internal(paVar40,pAVar11);
                    goto LAB_0013ff58;
                  }
                  paVar40->n = uVar24 + 1;
                  ppAVar12[uVar24] = pAVar11;
                }
LAB_0013ff58:
                bVar20 = true;
              }
              uVar43 = uVar43 + 1;
            } while (uVar43 < (pSVar9->shift_actions).n);
          }
          if (!bVar20) goto LAB_001408ac;
          pDVar30 = (DFAState *)calloc(1,0x830);
          local_88[0] = (DFAState *)0x0;
          local_88[1] = (DFAState *)0x0;
          local_98 = 0;
          ppDStack_90 = (DFAState **)0x0;
          local_88[2] = (DFAState *)0x0;
          (pDVar30->states).v = (pDVar30->states).e;
          (pDVar30->states).n = 1;
          (pDVar30->states).e[0] = pNVar25;
          nfa_closure(pDVar30);
          ppDStack_90 = local_88;
          local_98 = CONCAT44(local_98._4_4_,1);
          uVar43 = 0;
          local_88[0] = pDVar30;
          do {
            pDVar30 = ppDStack_90[uVar43];
            lVar34 = 0;
            do {
              uVar24 = (pDVar30->states).n;
              if (uVar24 != 0) {
                ppNVar35 = (pDVar30->states).v;
                uVar36 = 0;
                x = (DFAState *)0x0;
                do {
                  pNVar25 = ppNVar35[uVar36];
                  if (pNVar25->chars[lVar34].n != 0) {
                    uVar44 = 0;
                    do {
                      if (x == (DFAState *)0x0) {
                        x = (DFAState *)calloc(1,0x830);
                      }
                      set_add(x,pNVar25->chars[lVar34].v[uVar44]);
                      uVar44 = uVar44 + 1;
                      ppNVar35 = (pDVar30->states).v;
                      pNVar25 = ppNVar35[uVar36];
                    } while (uVar44 < pNVar25->chars[lVar34].n);
                    uVar24 = (pDVar30->states).n;
                  }
                  uVar36 = uVar36 + 1;
                } while (uVar36 < uVar24);
                if (x != (DFAState *)0x0) {
                  set_to_vec(x);
                  nfa_closure(x);
                  uVar36 = local_98 & 0xffffffff;
                  if (uVar36 != 0) {
                    uVar24 = (x->states).n;
                    uVar44 = 0;
                    do {
                      if (uVar24 == (ppDStack_90[uVar44]->states).n) {
                        if ((ulong)uVar24 == 0) {
LAB_00140100:
                          free_DFAState(x);
                          x = ppDStack_90[uVar44];
                          goto LAB_0014012f;
                        }
                        uVar46 = 0;
                        while ((x->states).v[uVar46] == (ppDStack_90[uVar44]->states).v[uVar46]) {
                          uVar46 = uVar46 + 1;
                          if (uVar24 == uVar46) goto LAB_00140100;
                        }
                      }
                      uVar44 = uVar44 + 1;
                    } while (uVar44 != uVar36);
                  }
                  if (ppDStack_90 == (DFAState **)0x0) {
                    ppDStack_90 = local_88;
                    local_98 = CONCAT44(local_98._4_4_,(uint)local_98 + 1);
                    local_88[uVar36] = x;
                  }
                  else {
                    if (ppDStack_90 == local_88) {
                      if (2 < (uint)local_98) goto LAB_00140164;
                    }
                    else if ((local_98 & 7) == 0) {
LAB_00140164:
                      vec_add_internal(&local_98,x);
                      goto LAB_0014012f;
                    }
                    local_98 = CONCAT44(local_98._4_4_,(uint)local_98 + 1);
                    ppDStack_90[uVar36] = x;
                  }
LAB_0014012f:
                  pDVar30->chars[lVar34] = x;
                }
              }
              lVar34 = lVar34 + 1;
            } while (lVar34 != 0x100);
            uVar43 = uVar43 + 1;
            uVar36 = local_98 & 0xffffffff;
          } while (uVar43 < uVar36);
          pSVar42 = &pSVar9->scanner;
          (pSVar9->scanner).states.n = 0;
          (pSVar9->scanner).states.v = (ScanState **)0x0;
          if ((uint)local_98 != 0) {
            ppSVar3 = (pSVar9->scanner).states.e;
            uVar43 = 0;
            do {
              pSVar31 = (ScanState *)calloc(1,0x1058);
              ppDStack_90[uVar43]->scan = pSVar31;
              pSVar31 = ppDStack_90[uVar43]->scan;
              pSVar31->index = (uint)uVar43;
              ppSVar15 = (pSVar9->scanner).states.v;
              if (ppSVar15 == (ScanState **)0x0) {
                (pSVar9->scanner).states.v = ppSVar3;
                uVar24 = (pSVar9->scanner).states.n;
                (pSVar9->scanner).states.n = uVar24 + 1;
                (pSVar9->scanner).states.e[uVar24] = pSVar31;
              }
              else {
                uVar24 = (pSVar42->states).n;
                if (ppSVar15 == ppSVar3) {
                  if (2 < uVar24) goto LAB_0014024b;
                }
                else if ((uVar24 & 7) == 0) {
LAB_0014024b:
                  vec_add_internal(pSVar42,pSVar31);
                  uVar36 = local_98 & 0xffffffff;
                  goto LAB_0014025a;
                }
                (pSVar42->states).n = uVar24 + 1;
                ppSVar15[uVar24] = pSVar31;
              }
LAB_0014025a:
              uVar43 = uVar43 + 1;
            } while (uVar43 < uVar36);
            if ((int)uVar36 != 0) {
              uVar43 = 0;
              do {
                lVar34 = 0;
                do {
                  pDVar30 = ppDStack_90[uVar43]->chars[lVar34];
                  if (pDVar30 != (DFAState *)0x0) {
                    ppDStack_90[uVar43]->scan->chars[lVar34] = pDVar30->scan;
                  }
                  lVar34 = lVar34 + 1;
                } while (lVar34 != 0x100);
                pDVar30 = ppDStack_90[uVar43];
                uVar44 = (ulong)(pDVar30->states).n;
                if (uVar44 != 0) {
                  iVar23 = -0x80000000;
                  uVar36 = 0;
                  do {
                    pNVar25 = (pDVar30->states).v[uVar36];
                    uVar46 = (ulong)(pNVar25->accepts).n;
                    if (uVar46 != 0) {
                      uVar47 = 0;
                      do {
                        iVar6 = (pNVar25->accepts).v[uVar47]->term->term_priority;
                        if (iVar23 <= iVar6) {
                          iVar23 = iVar6;
                        }
                        uVar47 = uVar47 + 1;
                      } while (uVar46 != uVar47);
                    }
                    uVar36 = uVar36 + 1;
                  } while (uVar36 != uVar44);
                  uVar36 = 0;
                  ppDVar32 = ppDStack_90;
                  do {
                    pNVar25 = (pDVar30->states).v[uVar36];
                    if ((pNVar25->accepts).n != 0) {
                      uVar44 = 0;
                      do {
                        pAVar11 = (pNVar25->accepts).v[uVar44];
                        if (pAVar11->term->term_priority == iVar23) {
                          pSVar31 = pDVar30->scan;
                          ppAVar12 = (pSVar31->accepts).v;
                          ppAVar14 = (pSVar31->accepts).e;
                          if (ppAVar12 == (Action **)0x0) {
                            (pSVar31->accepts).v = ppAVar14;
                            uVar24 = (ppDVar32[uVar43]->scan->accepts).n;
                            (ppDVar32[uVar43]->scan->accepts).n = uVar24 + 1;
                            (pSVar31->accepts).e[uVar24] = pAVar11;
                          }
                          else {
                            pVVar41 = &pSVar31->accepts;
                            uVar24 = pVVar41->n;
                            if (ppAVar12 == ppAVar14) {
                              if (2 < uVar24) goto LAB_0014039b;
                            }
                            else if ((uVar24 & 7) == 0) {
LAB_0014039b:
                              vec_add_internal(pVVar41,pAVar11);
                              goto LAB_001403a0;
                            }
                            pVVar41->n = uVar24 + 1;
                            ppAVar12[uVar24] = pAVar11;
                          }
                        }
LAB_001403a0:
                        uVar44 = uVar44 + 1;
                        pDVar30 = ppDStack_90[uVar43];
                        pNVar25 = (pDVar30->states).v[uVar36];
                        ppDVar32 = ppDStack_90;
                      } while (uVar44 < (pNVar25->accepts).n);
                      uVar44 = (ulong)(pDVar30->states).n;
                    }
                    uVar36 = uVar36 + 1;
                  } while (uVar36 < uVar44);
                  uVar36 = local_98 & 0xffffffff;
                }
                uVar43 = uVar43 + 1;
              } while (uVar43 < uVar36);
              if ((int)uVar36 != 0) {
                uVar43 = 0;
                do {
                  free_DFAState(ppDStack_90[uVar43]);
                  uVar43 = uVar43 + 1;
                } while (uVar43 < (local_98 & 0xffffffff));
              }
            }
          }
          if (ppDStack_90 != local_88 && ppDStack_90 != (DFAState **)0x0) {
            free(ppDStack_90);
          }
          if ((pSVar42->states).n == 0) {
            uVar43 = 0;
          }
          else {
            uVar36 = 0;
            do {
              pSVar31 = (pSVar9->scanner).states.v[uVar36];
              set_union(&pSVar31->live,&pSVar31->accepts);
              uVar36 = uVar36 + 1;
              uVar43 = (ulong)(pSVar9->scanner).states.n;
            } while (uVar36 < uVar43);
          }
          do {
            if ((int)uVar43 == 0) goto LAB_0014086a;
            uVar36 = 0;
            bVar20 = false;
            do {
              pSVar31 = (pSVar9->scanner).states.v[uVar36];
              lVar34 = 1;
              do {
                pSVar16 = pSVar31->chars[lVar34 + -1];
                if ((pSVar31 != pSVar16 && pSVar16 != (ScanState *)0x0) &&
                   (iVar23 = set_union(&pSVar31->live,&pSVar16->live), iVar23 != 0)) {
                  bVar20 = true;
                }
                lVar34 = lVar34 + 1;
              } while (lVar34 != 0x101);
              uVar36 = uVar36 + 1;
              uVar24 = (pSVar42->states).n;
              uVar43 = (ulong)uVar24;
            } while (uVar36 < uVar43);
          } while (bVar20);
          if (uVar24 == 0) {
LAB_0014086a:
            trans_hash_fns.data[0] = (void *)0x1;
          }
          else {
            uVar43 = 0;
            do {
              pVVar41 = &(pSVar9->scanner).states.v[uVar43]->live;
              set_to_vec(pVVar41);
              sort_VecAction(pVVar41);
              uVar43 = uVar43 + 1;
              uVar24 = (pSVar9->scanner).states.n;
            } while (uVar43 < uVar24);
            trans_hash_fns.data[0] = (void *)0x1;
            if (uVar24 != 0) {
              ppNVar35 = (NFAState **)0x0;
              t = (ScanStateTransition *)0x0;
LAB_00140554:
              pSVar31 = (pSVar9->scanner).states.v[(long)ppNVar35];
              lVar34 = 0;
              local_68 = ppNVar35;
LAB_0014056b:
              if (t == (ScanStateTransition *)0x0) {
                t = (ScanStateTransition *)calloc(1,0x58);
              }
              pSVar16 = pSVar31->chars[lVar34];
              if (pSVar16 != (ScanState *)0x0) {
                pVVar41 = &t->live_diff;
                uVar24 = (pSVar31->live).n;
                if (uVar24 != 0) {
                  ppAVar14 = (t->live_diff).e;
                  uVar43 = 0;
                  uVar36 = 0;
                  while ((uint)uVar43 < (pSVar16->live).n) {
                    while( true ) {
                      pAVar11 = (pSVar31->live).v[uVar36];
                      uVar49 = (pSVar16->live).v[uVar43]->index;
                      if (pAVar11->index == uVar49) break;
                      if (pAVar11->index < uVar49) {
                        ppAVar12 = (t->live_diff).v;
                        if (ppAVar12 == (Action **)0x0) {
                          (t->live_diff).v = ppAVar14;
                          uVar24 = (t->live_diff).n;
                          (t->live_diff).n = uVar24 + 1;
                          (t->live_diff).e[uVar24] = pAVar11;
                        }
                        else {
                          uVar24 = pVVar41->n;
                          if (ppAVar12 == ppAVar14) {
                            if (2 < uVar24) goto LAB_00140625;
                          }
                          else if ((uVar24 & 7) == 0) {
LAB_00140625:
                            vec_add_internal(pVVar41,pAVar11);
                            goto LAB_0014062f;
                          }
                          pVVar41->n = uVar24 + 1;
                          ppAVar12[uVar24] = pAVar11;
                        }
LAB_0014062f:
                        uVar49 = (int)uVar36 + 1;
                        uVar36 = (ulong)uVar49;
                        uVar24 = (pSVar31->live).n;
                        if (uVar24 <= uVar49) goto LAB_001406e5;
                      }
                      else {
                        uVar43 = uVar43 + 1;
                        if ((pSVar16->live).n <= uVar43) goto LAB_00140668;
                      }
                    }
                    uVar49 = (int)uVar36 + 1;
                    uVar36 = (ulong)uVar49;
                    uVar43 = (ulong)((int)uVar43 + 1);
                    if (uVar24 <= uVar49) goto LAB_001406e5;
                  }
LAB_00140668:
                  if ((uint)uVar36 < uVar24) goto LAB_00140670;
                }
                goto LAB_001406e5;
              }
              goto LAB_0014079e;
            }
          }
          goto LAB_00140875;
        }
        goto LAB_001408ac;
      }
      goto LAB_001409b2;
    }
    uVar24 = 0;
  }
LAB_001409cd:
  if (d_verbose_level != 0) {
    printf("%d scanners %d transitions\n",(ulong)uVar24,(ulong)ls->transitions);
  }
  free(ls);
  return;
LAB_00140670:
  do {
    ppAVar12 = (t->live_diff).v;
    if (ppAVar12 == (Action **)0x0) {
      pAVar11 = (pSVar31->live).v[uVar36];
      (t->live_diff).v = ppAVar14;
      uVar24 = (t->live_diff).n;
      (t->live_diff).n = uVar24 + 1;
      (t->live_diff).e[uVar24] = pAVar11;
    }
    else {
      uVar24 = pVVar41->n;
      if (ppAVar12 == ppAVar14) {
        ppAVar38 = (pSVar31->live).v;
        if (2 < uVar24) goto LAB_001406c8;
      }
      else {
        ppAVar38 = (pSVar31->live).v;
        if ((uVar24 & 7) == 0) {
LAB_001406c8:
          vec_add_internal(pVVar41,ppAVar38[uVar36]);
          goto LAB_001406d6;
        }
      }
      pAVar11 = ppAVar38[uVar36];
      pVVar41->n = uVar24 + 1;
      ppAVar12[uVar24] = pAVar11;
    }
LAB_001406d6:
    uVar36 = uVar36 + 1;
  } while (uVar36 < (pSVar31->live).n);
LAB_001406e5:
  uVar24 = (pSVar31->accepts).n;
  if (uVar24 != 0) {
    v = &t->accepts_diff;
    ppAVar14 = (t->accepts_diff).e;
    uVar43 = 0;
    uVar49 = 0;
LAB_00140701:
    if ((uint)uVar43 < pVVar41->n) {
LAB_0014071a:
      uVar7 = (t->live_diff).v[uVar43]->index;
      do {
        pAVar11 = (pSVar31->accepts).v[uVar49];
        if (pAVar11->index == uVar7) {
          ppAVar12 = (t->accepts_diff).v;
          if (ppAVar12 == (Action **)0x0) {
            (t->accepts_diff).v = ppAVar14;
            uVar24 = (t->accepts_diff).n;
            (t->accepts_diff).n = uVar24 + 1;
            (t->accepts_diff).e[uVar24] = pAVar11;
          }
          else {
            uVar24 = v->n;
            if (ppAVar12 == ppAVar14) {
              if (2 < uVar24) goto LAB_0014077d;
            }
            else if ((uVar24 & 7) == 0) {
LAB_0014077d:
              vec_add_internal(v,pAVar11);
              goto LAB_0014078a;
            }
            v->n = uVar24 + 1;
            ppAVar12[uVar24] = pAVar11;
          }
LAB_0014078a:
          uVar49 = uVar49 + 1;
          uVar43 = (ulong)((int)uVar43 + 1);
          uVar24 = (pSVar31->accepts).n;
          if (uVar49 < uVar24) goto LAB_00140701;
          break;
        }
        if (uVar7 <= pAVar11->index) goto LAB_00140738;
        uVar49 = uVar49 + 1;
        if (uVar24 <= uVar49) break;
      } while( true );
    }
  }
LAB_0014079e:
  pSVar33 = (ScanStateTransition *)set_add_fn(&(pSVar9->scanner).transitions,t,&trans_hash_fns);
  if (pSVar33 == t) {
    t = (ScanStateTransition *)0x0;
  }
  else {
    ppAVar14 = (t->live_diff).v;
    if (ppAVar14 != (t->live_diff).e && ppAVar14 != (Action **)0x0) {
      free(ppAVar14);
    }
    (t->live_diff).n = 0;
    (t->live_diff).v = (Action **)0x0;
    ppAVar14 = (t->accepts_diff).v;
    if (ppAVar14 != (t->accepts_diff).e && ppAVar14 != (Action **)0x0) {
      free(ppAVar14);
    }
    (t->accepts_diff).n = 0;
    (t->accepts_diff).v = (Action **)0x0;
  }
  pSVar31->transition[lVar34] = pSVar33;
  lVar34 = lVar34 + 1;
  if (lVar34 == 0x100) goto code_r0x00140839;
  goto LAB_0014056b;
LAB_00140738:
  uVar43 = uVar43 + 1;
  if (uVar43 == pVVar41->n) goto LAB_0014079e;
  goto LAB_0014071a;
code_r0x00140839:
  ppNVar35 = (NFAState **)((long)local_68 + 1);
  if ((undefined8 *)(ulong)(pSVar42->states).n <= ppNVar35) goto code_r0x00140851;
  goto LAB_00140554;
code_r0x00140851:
  if (t != (ScanStateTransition *)0x0) {
    free(t);
  }
LAB_00140875:
  set_to_vec(&(pSVar9->scanner).transitions);
  uVar24 = (pSVar9->scanner).transitions.n;
  if ((ulong)uVar24 != 0) {
    ppSVar17 = (pSVar9->scanner).transitions.v;
    uVar43 = 0;
    do {
      ppSVar17[uVar43]->index = (uint)uVar43;
      uVar43 = uVar43 + 1;
    } while (uVar24 != uVar43);
  }
  ls->transitions = ls->transitions + uVar24;
LAB_001408ac:
  if ((ls->allnfas).n != 0) {
    uVar43 = 0;
    do {
      pNVar25 = (ls->allnfas).v[uVar43];
      ppNVar35 = pNVar25->chars[0].e;
      lVar34 = 0x100;
      do {
        ppNVar37 = (NFAState **)ppNVar35[-1];
        if (ppNVar35 != ppNVar37 && ppNVar37 != (NFAState **)0x0) {
          free(ppNVar37);
        }
        ((anon_struct_40_4_d8687ec6 *)(ppNVar35 + -2))->n = 0;
        ppNVar35[-1] = (NFAState *)0x0;
        ppNVar35 = ppNVar35 + 5;
        lVar34 = lVar34 + -1;
      } while (lVar34 != 0);
      ppNVar35 = (pNVar25->epsilon).v;
      if (ppNVar35 != (pNVar25->epsilon).e && ppNVar35 != (NFAState **)0x0) {
        free(ppNVar35);
      }
      (pNVar25->epsilon).n = 0;
      (pNVar25->epsilon).v = (NFAState **)0x0;
      ppAVar14 = (pNVar25->accepts).v;
      if (ppAVar14 != (pNVar25->accepts).e && ppAVar14 != (Action **)0x0) {
        free(ppAVar14);
      }
      free(pNVar25);
      uVar43 = uVar43 + 1;
    } while (uVar43 < (ls->allnfas).n);
  }
  ppNVar35 = (ls->allnfas).v;
  if (ppNVar35 != local_48 && ppNVar35 != (NFAState **)0x0) {
    free(ppNVar35);
  }
  (ls->allnfas).n = 0;
  (ls->allnfas).v = (NFAState **)0x0;
  uVar24 = ls->scanners + 1;
  ls->scanners = uVar24;
  g = local_60;
  uVar43 = local_50;
LAB_001409b2:
  uVar43 = uVar43 + 1;
  if ((g->states).n <= uVar43) goto LAB_001409cd;
  goto LAB_0013f70f;
}

Assistant:

void build_scanners(Grammar *g) {
  uint i, j, k;
  State *s;
  LexState *ls = new_LexState();

  /* detect identical scanners */
  for (i = 0; i < g->states.n; i++) {
    s = g->states.v[i];
    if (s->same_shifts) continue;
    for (j = 0; j < i; j++) {
      if (g->states.v[j]->same_shifts) continue;
      if (g->states.v[j]->shift_actions.n != s->shift_actions.n) continue;
      if (g->states.v[j]->scan_kind != s->scan_kind) continue;
      for (k = 0; k < g->states.v[j]->shift_actions.n; k++)
        if (s->shift_actions.v[k]->term != g->states.v[j]->shift_actions.v[k]->term) break;
      if (k >= g->states.v[j]->shift_actions.n) {
        s->same_shifts = g->states.v[j];
        break;
      }
    }
  }
  /* build scanners */
  for (i = 0; i < g->states.n; i++) {
    s = g->states.v[i];
    if (s->shift_actions.n) {
      if (s->same_shifts)
        s->scanner = s->same_shifts->scanner;
      else
        build_state_scanner(g, ls, s);
    }
  }
  if (d_verbose_level) printf("%d scanners %d transitions\n", ls->scanners, ls->transitions);
  FREE(ls);
}